

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O3

void Cba_BlastMultiplier2
               (Gia_Man_t *pNew,int *pArg0,int *pArg1,int nBits,Vec_Int_t *vTemp,Vec_Int_t *vRes)

{
  size_t __size;
  int Entry;
  int *piVar1;
  ulong uVar2;
  
  if (vRes->nCap < nBits) {
    if (vRes->pArray == (int *)0x0) {
      piVar1 = (int *)malloc((long)nBits << 2);
    }
    else {
      piVar1 = (int *)realloc(vRes->pArray,(long)nBits << 2);
    }
    vRes->pArray = piVar1;
    if (piVar1 == (int *)0x0) {
LAB_008b15eb:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vRes->nCap = nBits;
  }
  if (nBits < 1) {
    vRes->nSize = nBits;
  }
  else {
    uVar2 = 0;
    memset(vRes->pArray,0,(ulong)(uint)nBits * 4);
    vRes->nSize = nBits;
    do {
      __size = uVar2 * 4;
      if ((long)vTemp->nCap < (long)uVar2) {
        if (vTemp->pArray == (int *)0x0) {
          piVar1 = (int *)malloc(__size);
        }
        else {
          piVar1 = (int *)realloc(vTemp->pArray,__size);
        }
        vTemp->pArray = piVar1;
        if (piVar1 == (int *)0x0) goto LAB_008b15eb;
        vTemp->nCap = (int)uVar2;
      }
      if (uVar2 != 0) {
        memset(vTemp->pArray,0,__size);
      }
      vTemp->nSize = (int)uVar2;
      piVar1 = pArg0;
      do {
        Entry = Gia_ManHashAnd(pNew,*piVar1,pArg1[uVar2]);
        Vec_IntPush(vTemp,Entry);
        piVar1 = piVar1 + 1;
      } while (vTemp->nSize < nBits);
      if (vTemp->nSize != nBits) {
        __assert_fail("Vec_IntSize(vTemp) == nBits",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaBlast.c"
                      ,0x15e,
                      "void Cba_BlastMultiplier2(Gia_Man_t *, int *, int *, int, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      Cba_BlastAdder(pNew,0,vRes->pArray,vTemp->pArray,nBits);
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)nBits);
  }
  return;
}

Assistant:

void Cba_BlastMultiplier2( Gia_Man_t * pNew, int * pArg0, int * pArg1, int nBits, Vec_Int_t * vTemp, Vec_Int_t * vRes )
{
    int i, j;
    Vec_IntFill( vRes, nBits, 0 );
    for ( i = 0; i < nBits; i++ )
    {
        Vec_IntFill( vTemp, i, 0 );
        for ( j = 0; Vec_IntSize(vTemp) < nBits; j++ )
            Vec_IntPush( vTemp, Gia_ManHashAnd(pNew, pArg0[j], pArg1[i]) );
        assert( Vec_IntSize(vTemp) == nBits );
        Cba_BlastAdder( pNew, 0, Vec_IntArray(vRes), Vec_IntArray(vTemp), nBits );
    }
}